

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImTriangleClosestPoint(ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p)

{
  float fVar1;
  float rhs;
  ImVec2 a_00;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float m;
  float dist2_ca;
  float dist2_bc;
  float dist2_ab;
  ImVec2 proj_ca;
  ImVec2 proj_bc;
  ImVec2 proj_ab;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 local_64;
  float local_5c;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  float in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  float fVar4;
  ImVec2 *in_stack_ffffffffffffffc0;
  ImVec2 *in_stack_ffffffffffffffc8;
  ImVec2 local_8;
  
  local_8 = ImLineClosestPoint(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                               (ImVec2 *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  a_00 = ImLineClosestPoint(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  IVar2 = ImLineClosestPoint((ImVec2 *)a_00,in_stack_ffffffffffffffc0,
                             (ImVec2 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                            );
  IVar3 = operator-(in_stack_ffffffffffffff88,(ImVec2 *)0x171855);
  local_4c = IVar3.x;
  fVar1 = ImLengthSqr((ImVec2 *)&local_4c);
  local_58 = operator-(in_stack_ffffffffffffff88,(ImVec2 *)0x17187a);
  local_50 = ImLengthSqr(&local_58);
  local_64 = operator-(in_stack_ffffffffffffff88,(ImVec2 *)0x17189f);
  local_5c = ImLengthSqr(&local_64);
  fVar4 = fVar1;
  rhs = ImMin<float>(local_50,local_5c);
  fVar1 = ImMin<float>(fVar1,rhs);
  if ((((fVar1 != fVar4) || (NAN(fVar1) || NAN(fVar4))) && (local_8 = IVar2, fVar1 == local_50)) &&
     (!NAN(fVar1) && !NAN(local_50))) {
    local_8 = a_00;
  }
  return local_8;
}

Assistant:

ImVec2 ImTriangleClosestPoint(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p)
{
    ImVec2 proj_ab = ImLineClosestPoint(a, b, p);
    ImVec2 proj_bc = ImLineClosestPoint(b, c, p);
    ImVec2 proj_ca = ImLineClosestPoint(c, a, p);
    float dist2_ab = ImLengthSqr(p - proj_ab);
    float dist2_bc = ImLengthSqr(p - proj_bc);
    float dist2_ca = ImLengthSqr(p - proj_ca);
    float m = ImMin(dist2_ab, ImMin(dist2_bc, dist2_ca));
    if (m == dist2_ab)
        return proj_ab;
    if (m == dist2_bc)
        return proj_bc;
    return proj_ca;
}